

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  long in_RCX;
  long in_RSI;
  ZSTD_CCtx *in_RDI;
  void *in_R8;
  unsigned_long_long in_R9;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *in_stack_ffffffffffffff68;
  ZSTD_CCtx *cctx;
  ZSTD_CCtx *cctx_00;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  size_t local_8;
  
  local_8 = ZSTD_CCtx_reset(in_stack_ffffffffffffff68,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_setPledgedSrcSize(in_RDI,in_R9);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      cctx = *(ZSTD_CCtx **)((long)in_R8 + 4);
      cctx_00 = *(ZSTD_CCtx **)((long)in_R8 + 0xc);
      cParams.chainLog = in_stack_ffffffffffffff84;
      cParams.windowLog = *(undefined4 *)((long)in_R8 + 0x1c);
      cParams.hashLog = (int)in_stack_ffffffffffffff88;
      cParams.searchLog = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      cParams.minMatch = (int)in_stack_ffffffffffffff90;
      cParams.targetLength = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      cParams.strategy = (ZSTD_strategy)cctx;
      ZSTD_checkCParams(cParams);
      uVar1 = ZSTD_isError(0x23da5a);
      if (uVar1 != 0) {
        __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6733,
                      "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                     );
      }
      memcpy(&in_RDI->requestedParams,in_R8,0xd0);
      if ((in_RSI != 0) && (in_RCX != 0)) {
        __assert_fail("!((dict) && (cdict))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6735,
                      "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                     );
      }
      if (in_RSI == 0) {
        local_8 = ZSTD_CCtx_refCDict(cctx,(ZSTD_CDict *)0x23db31);
        uVar1 = ERR_isError(local_8);
      }
      else {
        local_8 = ZSTD_CCtx_loadDictionary(cctx_00,cctx,0x23daf6);
        uVar1 = ERR_isError(local_8);
      }
      if (uVar1 == 0) {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}